

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsValueRef
WScriptJsrt::LeavingCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  RuntimeThreadLocalData *pRVar2;
  undefined2 in_register_0000000a;
  JsValueRef local_18;
  JsValueRef returnValue;
  
  local_18 = (JsValueRef)0x0;
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_18);
  if ((CONCAT22(in_register_0000000a,argumentCount) != 0) && (JVar1 == JsNoError)) {
    pRVar2 = GetRuntimeThreadLocalData();
    if (pRVar2->threadData != (RuntimeThreadData *)0x0) {
      pRVar2->threadData->leaving = true;
    }
  }
  return local_18;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::LeavingCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 0)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            threadData->leaving = true;
        }
    }

Error:
    return returnValue;
}